

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O0

FT_Error tt_face_load_fpgm(TT_Face face,FT_Stream stream)

{
  FT_ULong local_28;
  FT_ULong table_len;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  pFStack_18 = stream;
  stream_local = (FT_Stream)face;
  table_len._4_4_ = (*face->goto_table)(face,0x6670676d,stream,&local_28);
  if (table_len._4_4_ == 0) {
    stream_local[0xd].size = local_28;
    table_len._4_4_ = FT_Stream_ExtractFrame(pFStack_18,local_28,(FT_Byte **)&stream_local[0xd].pos)
    ;
  }
  else {
    stream_local[0xd].pos = 0;
    stream_local[0xd].size = 0;
    table_len._4_4_ = 0;
  }
  return table_len._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_fpgm( TT_Face    face,
                     FT_Stream  stream )
  {
#ifdef TT_USE_BYTECODE_INTERPRETER

    FT_Error  error;
    FT_ULong  table_len;


    FT_TRACE2(( "Font program " ));

    /* The font program is optional */
    error = face->goto_table( face, TTAG_fpgm, stream, &table_len );
    if ( error )
    {
      face->font_program      = NULL;
      face->font_program_size = 0;
      error                   = FT_Err_Ok;

      FT_TRACE2(( "is missing\n" ));
    }
    else
    {
      face->font_program_size = table_len;
      if ( FT_FRAME_EXTRACT( table_len, face->font_program ) )
        goto Exit;

      FT_TRACE2(( "loaded, %12d bytes\n", face->font_program_size ));
    }

  Exit:
    return error;

#else /* !TT_USE_BYTECODE_INTERPRETER */

    FT_UNUSED( face   );
    FT_UNUSED( stream );

    return FT_Err_Ok;

#endif
  }